

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void * raviX_ptrlist_delete_last(PtrList **self)

{
  PtrList *pPVar1;
  PtrList *pPVar2;
  byte bVar3;
  C_MemoryAllocator *alloc;
  PtrList *first;
  PtrList *last;
  void *ptr;
  PtrList **self_local;
  
  last = (PtrList *)0x0;
  pPVar1 = *self;
  if (pPVar1 == (PtrList *)0x0) {
    self_local = (PtrList **)0x0;
  }
  else {
    pPVar2 = pPVar1->prev_;
    if ((char)*(ushort *)pPVar2 != '\0') {
      bVar3 = (char)*(ushort *)pPVar2 - 1;
      *(ushort *)pPVar2 = *(ushort *)pPVar2 & 0xff00 | (ushort)bVar3;
      last = (PtrList *)pPVar2->list_[(int)(short)(char)bVar3];
    }
    if ((char)*(ushort *)pPVar2 < '\x01') {
      pPVar1->prev_ = pPVar2->prev_;
      pPVar2->prev_->next_ = pPVar1;
      if (pPVar2 == pPVar1) {
        *self = (PtrList *)0x0;
      }
      (*pPVar2->allocator_->free)(pPVar2->allocator_->arena,pPVar2);
    }
    self_local = (PtrList **)last;
  }
  return self_local;
}

Assistant:

void *raviX_ptrlist_delete_last(PtrList **self)
{
	void *ptr = NULL;
	PtrList *last, *first = *self;

	if (!first)
		return NULL;
	last = first->prev_;
	if (last->nr_)
		ptr = last->list_[--last->nr_];
	if (last->nr_ <= 0) {
		first->prev_ = last->prev_;
		last->prev_->next_ = first;
		if (last == first)
			*self = NULL;
		C_MemoryAllocator *alloc = last->allocator_;
		alloc->free(alloc->arena, last);
	}
	return ptr;
}